

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O3

gpointer g_hash_table_lookup(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gboolean gVar2;
  GHashNode *pGVar3;
  gpointer pvVar4;
  GHashNode *pGVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  if (hash_table == (GHashTable *)0x0) {
    pvVar4 = (gpointer)0x0;
  }
  else {
    gVar1 = (*hash_table->hash_func)(key);
    uVar6 = 2;
    if (2 < gVar1) {
      uVar6 = (ulong)gVar1;
    }
    pvVar4 = (gpointer)0x0;
    uVar8 = uVar6 % (ulong)(uint)hash_table->mod;
    pGVar5 = hash_table->nodes;
    gVar1 = pGVar5[uVar8].key_hash;
    if (gVar1 != 0) {
      pGVar3 = pGVar5 + uVar8;
      iVar7 = 1;
      do {
        if (gVar1 == (guint)uVar6) {
          if (hash_table->key_equal_func == (GEqualFunc)0x0) {
            if (pGVar3->key == key) break;
          }
          else {
            gVar2 = (*hash_table->key_equal_func)(pGVar3->key,key);
            pGVar5 = hash_table->nodes;
            if (gVar2 != 0) break;
          }
        }
        uVar8 = (ulong)((int)uVar8 + iVar7 & hash_table->mask);
        pGVar3 = pGVar5 + uVar8;
        gVar1 = pGVar3->key_hash;
        iVar7 = iVar7 + 1;
      } while (gVar1 != 0);
      if (pGVar5[uVar8].key_hash == 0) {
        pvVar4 = (gpointer)0x0;
      }
      else {
        pvVar4 = pGVar5[uVar8].value;
      }
    }
  }
  return pvVar4;
}

Assistant:

gpointer g_hash_table_lookup (GHashTable   *hash_table,
        gconstpointer key)
{
    GHashNode *node;
    guint      node_index;

    if (hash_table == NULL) return NULL;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    return node->key_hash ? node->value : NULL;
}